

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O1

void js_memset_zero_nontemporal(void *dst,size_t sizeInBytes)

{
  ulong uVar1;
  
  if ((sizeInBytes & 0xf) != 0) {
    memset(dst,0,sizeInBytes);
    return;
  }
  if (sizeInBytes != 0) {
    uVar1 = 0;
    do {
      *(undefined8 *)((long)dst + uVar1) = 0;
      ((undefined8 *)((long)dst + uVar1))[1] = 0;
      uVar1 = uVar1 + 0x10;
    } while (uVar1 < sizeInBytes);
  }
  return;
}

Assistant:

void __stdcall js_memset_zero_nontemporal(__bcount(sizeInBytes) void *dst, size_t sizeInBytes)
{
    if ((sizeInBytes % sizeof(__m128i)) == 0)
    {
        size_t writeBytes = 0;
        __m128i simdZero = _mm_setzero_si128();
        for (__m128i * p = (__m128i *)dst; writeBytes < sizeInBytes; p += 1, writeBytes += sizeof(__m128i))
        {
            _mm_stream_si128(p, simdZero);
        }

        _mm_sfence();
    }
    // cannot do non-temporal store directly if set size is not multiple of sizeof(__m128i)
    else
    {
        memset(dst, 0, sizeInBytes);
    }
}